

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

Token * __thiscall pfederc::Lexer::next(Lexer *this)

{
  bool bVar1;
  type pTVar2;
  pointer pTVar3;
  Token *tok;
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> result;
  Lexer *this_local;
  
  if (this->currentToken == (Token *)0x0) {
    result._M_t.super___uniq_ptr_impl<pfederc::Token,_std::default_delete<pfederc::Token>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Token_*,_std::default_delete<pfederc::Token>_>.
    super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_impl<pfederc::Token,_std::default_delete<pfederc::Token>_>)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->lineIndices,(value_type_conflict1 *)&result);
    nextChar(this);
    this->currentEndIndex = 0;
  }
  else {
    bVar1 = Token::operator==(this->currentToken,TOK_EOF);
    if (bVar1) {
      return this->currentToken;
    }
  }
  nextToken((Lexer *)&tok);
  pTVar2 = std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::operator*
                     ((unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)&tok);
  pTVar3 = std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::get
                     ((unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)&tok);
  this->currentToken = pTVar3;
  std::
  vector<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>,_std::allocator<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>_>_>
  ::push_back(&this->tokens,(unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)&tok
             );
  std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::~unique_ptr
            ((unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)&tok);
  return pTVar2;
}

Assistant:

Token& Lexer::next() noexcept {
  if  (!currentToken) {
    lineIndices.push_back(0);
    nextChar();
    currentEndIndex = 0;
  } else if (*currentToken == TokenType::TOK_EOF)
    return *currentToken;


  std::unique_ptr<Token> result(nextToken());
  Token &tok = *result;
  currentToken = result.get();
  tokens.push_back(std::move(result));
  return tok;
}